

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O3

void dlib::blas_bindings::
     matrix_assign_blas<float,dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>>
               (assignable_ptr_matrix<float> *dest,
               matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>
               *src)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  local_38;
  
  if ((dest->ptr != (((src->m).lhs)->op).ptr) && (dest->ptr != (((((src->m).rhs)->op).m)->op).ptr))
  {
    matrix_assign_blas_helper<dlib::assignable_ptr_matrix<float>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,void>
    ::
    assign<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
              (dest,&src->m,src->s,false,false);
    return;
  }
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
  matrix(&local_38,dest->height,dest->width);
  matrix_assign_blas_helper<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,void>
  ::
  assign<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
            (&local_38,&src->m,src->s,false,false);
  if (0 < local_38.data.nr_) {
    lVar1 = dest->width;
    pfVar2 = dest->ptr;
    lVar3 = 0;
    pfVar4 = local_38.data.data;
    do {
      if (0 < local_38.data.nc_) {
        lVar5 = 0;
        do {
          pfVar2[lVar5] = pfVar4[lVar5];
          lVar5 = lVar5 + 1;
        } while (local_38.data.nc_ != lVar5);
      }
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + lVar1;
      pfVar4 = pfVar4 + local_38.data.nc_;
    } while (lVar3 != local_38.data.nr_);
  }
  if (local_38.data.data != (float *)0x0) {
    operator_delete__(local_38.data.data);
  }
  return;
}

Assistant:

void matrix_assign_blas (
            assignable_ptr_matrix<T>& dest,
            const src_exp& src
        )
        {
            if (src.aliases(mat(dest.ptr,dest.height,dest.width)))
            {
                matrix<T> temp(dest.nr(),dest.nc());
                matrix_assign_blas_proxy(temp,src,1,false, false);
                matrix_assign_default(dest,temp);
            }
            else
            {
                matrix_assign_blas_proxy(dest,src,1,false, false);
            }
        }